

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::WriteTargetClean(cmGlobalNinjaGenerator *this,ostream *os)

{
  cmGeneratedFileStream *os_00;
  allocator aStack_198;
  allocator local_197;
  allocator local_196;
  allocator local_195;
  allocator local_194;
  allocator local_193;
  allocator local_192;
  allocator local_191;
  ostream *local_190;
  string local_188;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  undefined1 local_88 [32];
  _Base_ptr local_68;
  size_t local_60;
  string local_50;
  
  os_00 = this->RulesFileStream;
  local_190 = os;
  std::__cxx11::string::string((string *)local_88,"CLEAN",&local_196);
  ninjaCmd_abi_cxx11_(&local_148,this);
  std::operator+(&local_128,&local_148," -t clean");
  std::__cxx11::string::string((string *)&local_168,"Cleaning all built files...",&local_197);
  std::__cxx11::string::string((string *)&local_c8,"Rule for cleaning all built files.",&aStack_198)
  ;
  std::__cxx11::string::string((string *)&local_188,"",&local_191);
  std::__cxx11::string::string((string *)&local_a8,"",&local_192);
  std::__cxx11::string::string((string *)&local_e8,"",&local_193);
  std::__cxx11::string::string((string *)&local_108,"",&local_194);
  std::__cxx11::string::string((string *)&local_50,"",&local_195);
  WriteRule((ostream *)os_00,(string *)local_88,&local_128,&local_168,&local_c8,&local_188,&local_a8
            ,&local_e8,&local_108,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::string
            ((string *)&local_128,"Clean all the built files.",(allocator *)&local_50);
  std::__cxx11::string::string((string *)&local_148,"CLEAN",&local_196);
  std::__cxx11::string::string((string *)&local_168,"clean",&local_197);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_188,1,&local_168,(allocator_type *)&aStack_198);
  local_a8.field_2._M_allocated_capacity = 0;
  local_e8.field_2._M_allocated_capacity = 0;
  local_108.field_2._M_allocated_capacity = 0;
  local_a8._M_dataplus._M_p = (pointer)0x0;
  local_a8._M_string_length = 0;
  local_88._24_8_ = local_88 + 8;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = 0;
  local_60 = 0;
  local_e8._M_dataplus._M_p = (pointer)0x0;
  local_e8._M_string_length = 0;
  local_108._M_dataplus._M_p = (pointer)0x0;
  local_108._M_string_length = 0;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_68 = (_Base_ptr)local_88._24_8_;
  WriteBuild(this,local_190,&local_128,&local_148,(cmNinjaDeps *)&local_188,(cmNinjaDeps *)&local_a8
             ,(cmNinjaDeps *)&local_e8,(cmNinjaDeps *)&local_108,(cmNinjaVars *)local_88,&local_c8,
             -1,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetClean(std::ostream& os)
{
  WriteRule(*this->RulesFileStream,
            "CLEAN",
            ninjaCmd() + " -t clean",
            "Cleaning all built files...",
            "Rule for cleaning all built files.",
            /*depfile=*/ "",
            /*deptype=*/ "",
            /*rspfile=*/ "",
            /*rspcontent*/ "",
            /*restat=*/ "",
            /*generator=*/ false);
  WriteBuild(os,
             "Clean all the built files.",
             "CLEAN",
             /*outputs=*/ cmNinjaDeps(1, "clean"),
             /*explicitDeps=*/ cmNinjaDeps(),
             /*implicitDeps=*/ cmNinjaDeps(),
             /*orderOnlyDeps=*/ cmNinjaDeps(),
             /*variables=*/ cmNinjaVars());
}